

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

ktx_error_code_e anon_unknown.dwarf_59e0::StreambufStream::getsize(ktxStream *str,ktx_size_t *size)

{
  bool bVar1;
  ktx_error_code_e kVar2;
  pointer pbVar3;
  fpos<__mbstate_t> *__rhs;
  ulong uVar4;
  fpos<__mbstate_t> *__lhs;
  streamoff sVar5;
  ostream *poVar6;
  ulong *in_RSI;
  ktxStream *in_RDI;
  streampos newpos;
  streampos oldpos;
  StreambufStream *self;
  fpos local_38 [16];
  fpos local_28 [16];
  StreambufStream *local_18;
  ulong *local_10;
  
  local_10 = in_RSI;
  local_18 = parent(in_RDI);
  pbVar3 = std::
           unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                         *)0x10dbeb);
  local_28 = (fpos  [16])std::streambuf::pubseekoff((long)pbVar3,_S_beg,_S_app);
  __rhs = (fpos<__mbstate_t> *)
          std::
          unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
          ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                        *)0x10dc1c);
  std::operator|(_S_in,_S_out);
  local_38 = (fpos  [16])std::streambuf::pubseekoff((long)__rhs,_S_beg,_S_ate);
  uVar4 = std::fpos::operator_cast_to_long(local_38);
  *local_10 = uVar4;
  __lhs = (fpos<__mbstate_t> *)
          std::
          unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
          ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                        *)0x10dc70);
  sVar5 = std::fpos::operator_cast_to_long(local_28);
  std::streambuf::pubseekoff
            ((long)__lhs,(_Ios_Seekdir)sVar5,~(_S_ios_openmode_min|_S_ios_openmode_max));
  poVar6 = std::operator<<((ostream *)&std::cerr,"\t  size: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_10);
  poVar6 = std::operator<<(poVar6,'B');
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==(__lhs,__rhs);
  kVar2 = KTX_FILE_SEEK_ERROR;
  if (bVar1) {
    kVar2 = KTX_SUCCESS;
  }
  return kVar2;
}

Assistant:

static KTX_error_code getsize(ktxStream* str, ktx_size_t* size)
    {
        auto self = parent(str);
        const std::streampos oldpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        *size = ktx_size_t(self->_streambuf->pubseekoff(0, std::ios::end));
        const std::streampos newpos = self->_streambuf->pubseekoff(oldpos, std::ios::beg, self->_seek_mode);
        std::cerr << "\t  size: " << *size << 'B' << std::endl;
        return (oldpos == newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }